

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O2

UnicodeString *
icu_63::SimpleFormatter::getTextWithNoArguments
          (UnicodeString *__return_storage_ptr__,UChar *compiledPattern,
          int32_t compiledPatternLength)

{
  long lVar1;
  uint uVar2;
  int srcLength;
  int iVar3;
  ConstChar16Ptr local_48;
  UChar *local_40;
  
  if (compiledPatternLength == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = ~(uint)(ushort)*compiledPattern;
  }
  UnicodeString::UnicodeString(__return_storage_ptr__,uVar2 + compiledPatternLength,0,0);
  iVar3 = 1;
  while (iVar3 < compiledPatternLength) {
    lVar1 = (long)iVar3;
    iVar3 = iVar3 + 1;
    if (0x100 < (ushort)compiledPattern[lVar1]) {
      srcLength = (ushort)compiledPattern[lVar1] - 0x100;
      local_48.p_ = compiledPattern + iVar3;
      UnicodeString::append(__return_storage_ptr__,&local_48,srcLength);
      local_40 = local_48.p_;
      iVar3 = iVar3 + srcLength;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString SimpleFormatter::getTextWithNoArguments(
        const UChar *compiledPattern, int32_t compiledPatternLength) {
    int32_t capacity = compiledPatternLength - 1 -
            getArgumentLimit(compiledPattern, compiledPatternLength);
    UnicodeString sb(capacity, 0, 0);  // Java: StringBuilder
    for (int32_t i = 1; i < compiledPatternLength;) {
        int32_t segmentLength = compiledPattern[i++] - ARG_NUM_LIMIT;
        if (segmentLength > 0) {
            sb.append(compiledPattern + i, segmentLength);
            i += segmentLength;
        }
    }
    return sb;
}